

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O2

void __thiscall flatbuffers::FlatBufMethod::FlatBufMethod(FlatBufMethod *this,RPCCall *method)

{
  bool bVar1;
  Value *pVVar2;
  string *__lhs;
  allocator<char> local_39;
  string local_38;
  
  (this->super_Method).super_CommentHolder._vptr_CommentHolder =
       (_func_int **)&PTR__CommentHolder_002fb2c0;
  this->method_ = method;
  this->streaming_ = kNone;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"streaming",&local_39);
  pVVar2 = SymbolTable<flatbuffers::Value>::Lookup(&(method->super_Definition).attributes,&local_38)
  ;
  std::__cxx11::string::~string((string *)&local_38);
  if (pVVar2 != (Value *)0x0) {
    __lhs = &pVVar2->constant;
    bVar1 = std::operator==(__lhs,"client");
    if (bVar1) {
      this->streaming_ = kClient;
    }
    bVar1 = std::operator==(__lhs,"server");
    if (bVar1) {
      this->streaming_ = kServer;
    }
    bVar1 = std::operator==(__lhs,"bidi");
    if (bVar1) {
      this->streaming_ = kBiDi;
    }
  }
  return;
}

Assistant:

FlatBufMethod(const RPCCall *method) : method_(method) {
    streaming_ = kNone;
    auto val = method_->attributes.Lookup("streaming");
    if (val) {
      if (val->constant == "client") streaming_ = kClient;
      if (val->constant == "server") streaming_ = kServer;
      if (val->constant == "bidi") streaming_ = kBiDi;
    }
  }